

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

bool __thiscall IR::Instr::IsNeq(Instr *this)

{
  OpCode OVar1;
  bool bVar2;
  
  OVar1 = this->m_opcode;
  bVar2 = true;
  if ((((0x35 < OVar1 - 0xd) || ((0x28000000000101U >> ((ulong)(OVar1 - 0xd) & 0x3f) & 1) == 0)) &&
      ((0x3e < OVar1 - 0x196 || ((0x4000000004000001U >> ((ulong)(OVar1 - 0x196) & 0x3f) & 1) == 0))
      )) && (OVar1 != BrNotEq_A)) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Instr::IsNeq()
{
    switch (m_opcode)
    {
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrNeq_I4:
    case Js::OpCode::BrNotEq_A:
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::CmNeq_A:
    case Js::OpCode::CmNeq_I4:
    case Js::OpCode::CmSrNeq_A:
        return true;
    default:
        return false;
    }
}